

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

ProducerBase * __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::recycle_or_create_producer
          (ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
           *this,bool isExplicit,bool *recycled)

{
  ExplicitProducer *pEVar1;
  atomic<bool> *paVar2;
  ExplicitProducer *pEVar3;
  ConcurrentQueueProducerTypelessBase *pCVar4;
  __pointer_type pPVar5;
  __pointer_type pPVar6;
  ExplicitProducer *unaff_R14;
  bool bVar7;
  
  pEVar3 = (ExplicitProducer *)(this->producerListTail)._M_b._M_p;
  pEVar1 = pEVar3;
  while (pEVar1 != (ExplicitProducer *)0x0) {
    if ((((pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.inactive._M_base.
          _M_i & 1U) != 0) && ((pEVar3->super_ProducerBase).isExplicit == isExplicit)) {
      paVar2 = &(pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.inactive;
      LOCK();
      bVar7 = (paVar2->_M_base)._M_i == true;
      if (bVar7) {
        (paVar2->_M_base)._M_i = false;
      }
      UNLOCK();
      if (bVar7) {
        *recycled = true;
        unaff_R14 = pEVar3;
        break;
      }
    }
    pEVar1 = (ExplicitProducer *)
             (pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next;
    pEVar3 = (ExplicitProducer *)&pEVar1[-1].pr_blockIndexRaw;
  }
  if (pEVar1 != (ExplicitProducer *)0x0) {
    return &unaff_R14->super_ProducerBase;
  }
  *recycled = false;
  if (isExplicit) {
    pEVar3 = (ExplicitProducer *)malloc(0x88);
    if (pEVar3 != (ExplicitProducer *)0x0) {
      ExplicitProducer::ExplicitProducer(pEVar3,this);
      goto LAB_016fdfa6;
    }
  }
  else {
    pEVar3 = (ExplicitProducer *)malloc(0x68);
    if (pEVar3 != (ExplicitProducer *)0x0) {
      (pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next =
           (ConcurrentQueueProducerTypelessBase *)0x0;
      (pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.inactive._M_base._M_i =
           false;
      (pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.token =
           (ProducerToken *)0x0;
      (pEVar3->super_ProducerBase).tailIndex.super___atomic_base<unsigned_long>._M_i = 0;
      (pEVar3->super_ProducerBase).headIndex.super___atomic_base<unsigned_long>._M_i = 0;
      (pEVar3->super_ProducerBase).dequeueOptimisticCount.super___atomic_base<unsigned_long>._M_i =
           0;
      (pEVar3->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>._M_i = 0;
      *(undefined8 *)
       ((long)&(pEVar3->super_ProducerBase).dequeueOvercommit.super___atomic_base<unsigned_long>.
               _M_i + 1) = 0;
      *(undefined8 *)((long)&(pEVar3->super_ProducerBase).tailBlock + 1) = 0;
      (pEVar3->super_ProducerBase).parent = this;
      (pEVar3->super_ProducerBase)._vptr_ProducerBase =
           (_func_int **)&PTR__ImplicitProducer_024a9ca8;
      (pEVar3->blockIndex)._M_b._M_p = (__pointer_type)0x20;
      pEVar3->pr_blockIndexSlotsUsed = 0;
      ImplicitProducer::new_block_index((ImplicitProducer *)pEVar3);
      goto LAB_016fdfa6;
    }
  }
  pEVar3 = (ExplicitProducer *)0x0;
LAB_016fdfa6:
  if (pEVar3 == (ExplicitProducer *)0x0) {
    pEVar3 = (ExplicitProducer *)0x0;
  }
  else {
    LOCK();
    (this->producerCount).super___atomic_base<unsigned_int>._M_i =
         (this->producerCount).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    pPVar6 = (this->producerListTail)._M_b._M_p;
    do {
      pCVar4 = &pPVar6->super_ConcurrentQueueProducerTypelessBase;
      if (pPVar6 == (__pointer_type)0x0) {
        pCVar4 = (ConcurrentQueueProducerTypelessBase *)0x0;
      }
      (pEVar3->super_ProducerBase).super_ConcurrentQueueProducerTypelessBase.next = pCVar4;
      LOCK();
      pPVar5 = (this->producerListTail)._M_b._M_p;
      bVar7 = pPVar6 == pPVar5;
      if (bVar7) {
        (this->producerListTail)._M_b._M_p = &pEVar3->super_ProducerBase;
        pPVar5 = pPVar6;
      }
      UNLOCK();
      pPVar6 = pPVar5;
    } while (!bVar7);
  }
  return &pEVar3->super_ProducerBase;
}

Assistant:

ProducerBase* recycle_or_create_producer(bool isExplicit, bool& recycled)
	{
#ifdef MCDBGQ_NOLOCKFREE_IMPLICITPRODHASH
		debug::DebugLock lock(implicitProdMutex);
#endif
		// Try to re-use one first
		for (auto ptr = producerListTail.load(std::memory_order_acquire); ptr != nullptr; ptr = ptr->next_prod()) {
			if (ptr->inactive.load(std::memory_order_relaxed) && ptr->isExplicit == isExplicit) {
				bool expected = true;
				if (ptr->inactive.compare_exchange_strong(expected, /* desired */ false, std::memory_order_acquire, std::memory_order_relaxed)) {
					// We caught one! It's been marked as activated, the caller can have it
					recycled = true;
					return ptr;
				}
			}
		}
		
		recycled = false;
		return add_producer(isExplicit ? static_cast<ProducerBase*>(create<ExplicitProducer>(this)) : create<ImplicitProducer>(this));
	}